

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

UINT8 device_start_ym2413_emu(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  EOPLL *opll;
  uint rate;
  
  rate = cfg->clock / 0x48;
  if (cfg->srMode == '\x02') {
    if (rate <= cfg->smplRate) {
      rate = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    rate = cfg->smplRate;
  }
  opll = EOPLL_new(cfg->clock,rate);
  if (opll == (EOPLL *)0x0) {
    UVar1 = 0xff;
  }
  else {
    EOPLL_setChipType(opll,cfg->flags & 1);
    opll->_devData = (DEV_DATA)opll;
    retDevInf->dataPtr = &opll->_devData;
    retDevInf->sampleRate = rate;
    retDevInf->devDef = &devDef_YM2413_Emu;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_ym2413_emu(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	EOPLL* chip;
	uint32_t rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = EOPLL_new(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	EOPLL_setChipType(chip, cfg->flags & 0x01);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef_YM2413_Emu);
	return 0x00;
}